

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O0

void __thiscall ExportEmitArray_Array_Test::TestBody(ExportEmitArray_Array_Test *this)

{
  initializer_list<int> __l;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  string *psVar4;
  char *message;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  string actual;
  indent local_a8 [4];
  allocator<int> local_95;
  int local_94 [3];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> values;
  ostringstream os;
  ExportEmitArray_Array_Test *this_local;
  
  pstore::exchange::export_ns::ostringstream::ostringstream
            ((ostringstream *)
             &values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_94[0] = 2;
  local_94[1] = 3;
  local_94[2] = 5;
  local_88 = local_94;
  local_80 = 3;
  std::allocator<int>::allocator(&local_95);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,__l,&local_95);
  std::allocator<int>::~allocator(&local_95);
  local_a8[0].distance_ = 0;
  pstore::exchange::export_ns::indent::indent(local_a8);
  iVar2 = std::begin<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)local_78);
  iVar3 = std::end<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)local_78);
  pstore::exchange::export_ns::
  emit_array<pstore::exchange::export_ns::ostringstream,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ExportEmitArray_Array_Test::TestBody()::__0>
            (&values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_a8[0].distance_,iVar2._M_current,iVar3._M_current);
  psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                     ((ostringstream *)
                      &values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)&gtest_ar.message_,(string *)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_f0,"actual","\"[\\n  2,\\n  3,\\n  5\\n]\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [18])"[\n  2,\n  3,\n  5\n]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_emit.cpp"
               ,0x56,message);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  pstore::exchange::export_ns::ostringstream::~ostringstream
            ((ostringstream *)
             &values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

TEST (ExportEmitArray, Array) {
    pstore::exchange::export_ns::ostringstream os;
    std::vector<int> values{2, 3, 5};
    emit_array (os, pstore::exchange::export_ns::indent{}, std::begin (values), std::end (values),
                [] (pstore::exchange::export_ns::ostringstream & os1,
                    pstore::exchange::export_ns::indent ind, int v) { os1 << ind << v; });
    auto const actual = os.str ();
    EXPECT_EQ (actual, "[\n  2,\n  3,\n  5\n]");
}